

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

void __thiscall
AutoCodeGenPhase::EndPhase
          (AutoCodeGenPhase *this,Func *func,Phase phase,bool dump,bool isPhaseComplete)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ExecutionMode EVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  if (this->func != func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x481,"(this->func == func)","this->func == func");
    if (!bVar2) goto LAB_0041088b;
    *puVar5 = 0;
  }
  if (this->phase != phase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x482,"(this->phase == phase)","this->phase == phase");
    if (!bVar2) {
LAB_0041088b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (dump) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,SimpleJitPhase,sourceContextId,functionId)
    ;
    bVar2 = true;
    if (!bVar3) {
      EVar4 = JITTimeWorkItem::GetJitMode(func->m_workItem);
      bVar2 = EVar4 != SimpleJit;
    }
  }
  else {
    bVar2 = false;
  }
  this->dump = bVar2;
  this->isPhaseComplete = isPhaseComplete;
  return;
}

Assistant:

void EndPhase(Func * func, Js::Phase phase, bool dump, bool isPhaseComplete)
    {
        Assert(this->func == func);
        Assert(this->phase == phase);
        this->dump = dump && (PHASE_DUMP(Js::SimpleJitPhase, func) || !func->IsSimpleJit());
        this->isPhaseComplete = isPhaseComplete;
    }